

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_pubsub_on_channel_create(channel_s *ch)

{
  fio_match_fn p_Var1;
  fio_str_info_s ch_00;
  fio_str_info_s data;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [24];
  uintptr_t uVar5;
  fio_msg_internal_s *m_;
  fio_engine_set__ordered_s_ *pfVar6;
  uint32_t type;
  fio_engine_set__ordered_s_ *pfVar7;
  fio_lock_i ret;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 uVar8;
  uint7 uVar9;
  char *in_stack_ffffffffffffffd0;
  
  LOCK();
  UNLOCK();
  if (fio_postoffice.engines.lock != '\0') {
    do {
      fio_postoffice.engines.lock = '\x01';
      in_stack_ffffffffffffffd0 = &DAT_00000001;
      nanosleep((timespec *)&stack0xffffffffffffffc8,(timespec *)0x0);
      LOCK();
      UNLOCK();
    } while (fio_postoffice.engines.lock != '\0');
  }
  fio_postoffice.engines.lock = '\x01';
  if ((fio_postoffice.engines.set.ordered != (fio_engine_set__ordered_s_ *)0x0) &&
     (uVar5 = fio_postoffice.engines.set.pos, pfVar6 = fio_postoffice.engines.set.ordered,
     pfVar7 = fio_postoffice.engines.set.ordered, 0 < (long)fio_postoffice.engines.set.pos)) {
    do {
      if (pfVar7->hash != 0) {
        in_stack_ffffffffffffffb8 = ch->name;
        uVar2 = ch->name_len;
        uVar3 = ch->name;
        auVar4._8_8_ = uVar3;
        auVar4._0_8_ = uVar2;
        in_stack_ffffffffffffffac = 0;
        in_stack_ffffffffffffffb4 = (undefined4)(ch->name_len >> 0x20);
        auVar4._16_8_ = 0;
        (*pfVar7->obj->subscribe)(pfVar7->obj,(fio_str_info_s)(auVar4 << 0x40),ch->match);
        uVar5 = fio_postoffice.engines.set.pos;
        pfVar6 = fio_postoffice.engines.set.ordered;
      }
      pfVar7 = pfVar7 + 1;
    } while (pfVar7 < pfVar6 + uVar5);
  }
  LOCK();
  fio_postoffice.engines.lock = '\0';
  UNLOCK();
  if ((((fio_data->is_worker != '\0') && (ch != (channel_s *)0x0)) && (fio_data->workers != 1)) &&
     (cluster_data.uuid != 0)) {
    uVar8 = 0;
    uVar9 = 0;
    p_Var1 = ch->match;
    if (p_Var1 == (fio_match_fn)0x0) {
      type = 4;
    }
    else {
      uVar9 = (uint7)((ushort)((ulong)p_Var1 >> 0x30) & 0xff) |
              (uint7)((uint)((ulong)p_Var1 >> 0x20) & 0xff00) |
              ((uint7)((ulong)p_Var1 >> 8) & 0xff000000) >> 8 | (uint7)p_Var1 & 0xff000000 |
              (uint7)((((ulong)p_Var1 & 0xff0000) << 0x18) >> 8) |
              (uint7)((((ulong)p_Var1 & 0xff00) << 0x28) >> 8) |
              (uint7)((ulong)((long)p_Var1 << 0x38) >> 8);
      uVar8 = (undefined1)((ulong)p_Var1 >> 0x38);
      type = 6;
    }
    ch_00.len._0_4_ = 1;
    ch_00.capa = (ulong)in_stack_ffffffffffffffac << 0x20;
    ch_00.len._4_4_ = in_stack_ffffffffffffffb4;
    ch_00.data = in_stack_ffffffffffffffb8;
    data.len._0_1_ = uVar8;
    data.capa = in_stack_ffffffffffffffc0;
    data.len._1_7_ = uVar9;
    data.data = in_stack_ffffffffffffffd0;
    m_ = fio_msg_internal_create(0,type,ch_00,data,(int8_t)ch->name_len,(int8_t)ch->name);
    fio_cluster_client_sender(m_,-1);
  }
  return;
}

Assistant:

static void fio_pubsub_on_channel_create(channel_s *ch) {
  fio_lock(&fio_postoffice.engines.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.engines.set, pos) {
    if (!pos->hash)
      continue;
    pos->obj->subscribe(pos->obj,
                        (fio_str_info_s){.data = ch->name, .len = ch->name_len},
                        ch->match);
  }
  fio_unlock(&fio_postoffice.engines.lock);
  fio_cluster_inform_root_about_channel(ch, 1);
}